

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_23::RecordMessageNames
          (anon_unknown_23 *this,DescriptorProto *desc_proto,string_view prefix,
          btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  void **ppvVar1;
  const_iterator cVar2;
  string_view prefix_00;
  string full_name;
  undefined1 local_a8 [48];
  AlphaNum local_78;
  AlphaNum local_48;
  
  prefix_00._M_str =
       (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
        *)prefix._M_str;
  if (((byte)this[0x10] & 1) != 0) {
    if (desc_proto == (DescriptorProto *)0x0) {
      std::__cxx11::string::string
                ((string *)&full_name,(string *)(*(ulong *)(this + 0xd8) & 0xfffffffffffffffc));
    }
    else {
      local_a8._0_8_ = desc_proto;
      local_a8._8_8_ = (LogMessageData *)prefix._M_len;
      local_48.piece_ = absl::lts_20250127::NullSafeStringView(".");
      output = (btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_48;
      local_78.piece_._M_str = *(char **)(*(ulong *)(this + 0xd8) & 0xfffffffffffffffc);
      local_78.piece_._M_len = ((undefined8 *)(*(ulong *)(this + 0xd8) & 0xfffffffffffffffc))[1];
      absl::lts_20250127::StrCat_abi_cxx11_
                (&full_name,(lts_20250127 *)local_a8,(AlphaNum *)output,&local_78,(AlphaNum *)output
                );
    }
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
    ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_bool>
              *)local_a8,prefix_00._M_str,&full_name);
    ppvVar1 = internal::RepeatedPtrFieldBase::elements((RepeatedPtrFieldBase *)(this + 0x30));
    cVar2 = RepeatedPtrField<google::protobuf::DescriptorProto>::end
                      ((RepeatedPtrField<google::protobuf::DescriptorProto> *)(this + 0x30));
    for (; ppvVar1 != cVar2.it_; ppvVar1 = ppvVar1 + 1) {
      prefix_00._M_len = (size_t)full_name._M_dataplus._M_p;
      RecordMessageNames((anon_unknown_23 *)*ppvVar1,(DescriptorProto *)full_name._M_string_length,
                         prefix_00,output);
    }
    std::__cxx11::string::~string((string *)&full_name);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
             ,0x32,"desc_proto.has_name()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_a8);
}

Assistant:

void RecordMessageNames(const DescriptorProto& desc_proto,
                        absl::string_view prefix,
                        absl::btree_set<std::string>* output) {
  ABSL_CHECK(desc_proto.has_name());
  std::string full_name = prefix.empty()
                              ? desc_proto.name()
                              : absl::StrCat(prefix, ".", desc_proto.name());
  output->insert(full_name);

  for (const auto& d : desc_proto.nested_type()) {
    RecordMessageNames(d, full_name, output);
  }
}